

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::focusOutEvent(QTextEdit *this,QFocusEvent *e)

{
  QWidget *in_RDI;
  QEvent *unaff_retaddr;
  QTextEditPrivate *in_stack_00000008;
  QTextEditPrivate *d;
  QFocusEvent *in_stack_ffffffffffffffd8;
  
  d_func((QTextEdit *)0x6d4cf1);
  QWidget::focusOutEvent(in_RDI,in_stack_ffffffffffffffd8);
  QTextEditPrivate::sendControlEvent(in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void QTextEdit::focusOutEvent(QFocusEvent *e)
{
    Q_D(QTextEdit);
    QAbstractScrollArea::focusOutEvent(e);
    d->sendControlEvent(e);
}